

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directed_flag_complex.h
# Opt level: O0

bool __thiscall
cell_comparer_t::operator()
          (cell_comparer_t *this,directed_flag_complex_cell_t *lhs,directed_flag_complex_cell_t *rhs
          )

{
  unsigned_short uVar1;
  short sVar2;
  short sVar3;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  unsigned_short index;
  unsigned_short dimension;
  directed_flag_complex_cell_t *r;
  directed_flag_complex_cell_t *l;
  ushort local_34;
  
  uVar1 = cell_hasher_t::dimension;
  local_34 = 0;
  while( true ) {
    if (uVar1 + 1 <= (uint)local_34) {
      return true;
    }
    sVar2 = (**(code **)*in_RSI)(in_RSI,local_34);
    sVar3 = (**(code **)*in_RDX)(in_RDX,local_34);
    if (sVar2 != sVar3) break;
    local_34 = local_34 + 1;
  }
  return false;
}

Assistant:

bool operator()(const directed_flag_complex_cell_t& lhs, const directed_flag_complex_cell_t& rhs) const {
		// Always at most one of the two is a coboundary cell
		const directed_flag_complex_cell_t* l = &lhs;
		const directed_flag_complex_cell_t* r = &rhs;
#ifdef USE_CELLS_WITHOUT_DIMENSION
		unsigned short dimension = cell_hasher_t::dimension;
#else
		assert(l->dimension() == r->dimension());
		unsigned short dimension = l->dimension();
#endif
		for (unsigned short index = 0; index < dimension + 1; index++) {
			if (l->vertex(index) != r->vertex(index)) return false;
		}

		return true;
	}